

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryDecoder.cc
# Opt level: O2

int64_t __thiscall avro::BinaryDecoder::doDecodeLong(BinaryDecoder *this)

{
  ssize_t sVar1;
  int64_t iVar2;
  Exception *this_00;
  size_t in_RCX;
  void *in_RDX;
  undefined8 in_RSI;
  ulong uVar3;
  ulong input;
  allocator<char> local_41;
  string local_40;
  
  uVar3 = 0;
  input = 0;
  do {
    if (0x3f < uVar3) {
      this_00 = (Exception *)__cxa_allocate_exception(0x18);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"Invalid Avro varint",&local_41);
      Exception::Exception(this_00,&local_40);
      __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
    }
    sVar1 = StreamReader::read(&this->in_,(int)in_RSI,in_RDX,in_RCX);
    in_RCX = uVar3 & 0xffffffff;
    in_RDX = (void *)((ulong)((byte)sVar1 & 0x7f) << ((byte)in_RCX & 0x3f));
    input = input | (ulong)in_RDX;
    uVar3 = uVar3 + 7;
  } while ((char)(byte)sVar1 < '\0');
  iVar2 = decodeZigzag64(input);
  return iVar2;
}

Assistant:

int64_t BinaryDecoder::doDecodeLong() {
    uint64_t encoded = 0;
    int shift = 0;
    uint8_t u;
    do {
        if (shift >= 64) {
            throw Exception("Invalid Avro varint");
        }
        u = in_.read();
        encoded |= static_cast<uint64_t>(u & 0x7f) << shift;
        shift += 7;
    } while (u & 0x80);

    return decodeZigzag64(encoded);
}